

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcTriangleFans.cpp
# Opt level: O2

O3DGCErrorCode o3dgc::LoadBinData(Vector<long> *data,BinaryStream *bstream,unsigned_long *iterator)

{
  unsigned_long uVar1;
  unsigned_long uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  ulong local_38;
  
  BinaryStream::ReadUInt32ASCII(bstream,iterator);
  uVar2 = BinaryStream::ReadUInt32ASCII(bstream,iterator);
  Vector<long>::Allocate(data,uVar2 * 7);
  data->m_size = 0;
  for (uVar3 = 0; uVar3 < uVar2; uVar3 = uVar3 + 7) {
    uVar1 = *iterator;
    *iterator = uVar1 + 1;
    uVar5 = (ulong)(bstream->m_stream).m_buffer[uVar1];
    lVar4 = 7;
    while (bVar6 = lVar4 != 0, lVar4 = lVar4 + -1, bVar6) {
      local_38 = (ulong)((uint)uVar5 & 1);
      Vector<long>::PushBack(data,(long *)&local_38);
      uVar5 = uVar5 >> 1;
    }
  }
  return O3DGC_OK;
}

Assistant:

O3DGCErrorCode    LoadBinData(Vector<long> & data,
                                  const BinaryStream & bstream,
                                  unsigned long & iterator) 
    {
        bstream.ReadUInt32ASCII(iterator);
        const unsigned long size = bstream.ReadUInt32ASCII(iterator);
        long symbol;
        data.Allocate(size * O3DGC_BINARY_STREAM_BITS_PER_SYMBOL0);
        data.Clear();
        for(unsigned long i = 0; i < size;)
        {
            symbol = bstream.ReadUCharASCII(iterator);
            for(unsigned long h = 0; h < O3DGC_BINARY_STREAM_BITS_PER_SYMBOL0; ++h)
            {
                data.PushBack(symbol & 1);
                symbol >>= 1;
                ++i;
            }
        }
        return O3DGC_OK;
    }